

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoreboard.cpp
# Opt level: O1

void CScoreboard::ConKeyScoreboard(IResult *pResult,void *pUserData)

{
  int iVar1;
  
  iVar1 = (*pResult->_vptr_IResult[2])(pResult,0);
  if (iVar1 == 0) {
    *(undefined2 *)((long)pUserData + 0x10) = 0;
  }
  else if (*(char *)((long)pUserData + 0x10) == '\0') {
    *(undefined1 *)((long)pUserData + 0x11) = 1;
  }
  return;
}

Assistant:

void CScoreboard::ConKeyScoreboard(IConsole::IResult *pResult, void *pUserData)
{
	CScoreboard *pScoreboard = (CScoreboard *)pUserData;
	int Result = pResult->GetInteger(0);
	if(!Result)
	{
		pScoreboard->m_Activate = false;
		pScoreboard->m_Active = false;
	}
	else if(!pScoreboard->m_Active)
		pScoreboard->m_Activate = true;	
}